

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group.cxx
# Opt level: O0

void __thiscall Fl_Group::draw_child(Fl_Group *this,Fl_Widget *widget)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int y;
  int w;
  int h;
  Fl_Widget *widget_local;
  Fl_Group *this_local;
  
  uVar2 = Fl_Widget::visible(widget);
  if (uVar2 != 0) {
    bVar1 = Fl_Widget::type(widget);
    if (bVar1 < 0xf0) {
      iVar3 = Fl_Widget::x(widget);
      y = Fl_Widget::y(widget);
      w = Fl_Widget::w(widget);
      h = Fl_Widget::h(widget);
      iVar3 = fl_not_clipped(iVar3,y,w,h);
      if (iVar3 != 0) {
        Fl_Widget::clear_damage(widget,0x80);
        (*widget->_vptr_Fl_Widget[2])();
        Fl_Widget::clear_damage(widget,'\0');
      }
    }
  }
  return;
}

Assistant:

void Fl_Group::draw_child(Fl_Widget& widget) const {
  if (widget.visible() && widget.type() < FL_WINDOW &&
      fl_not_clipped(widget.x(), widget.y(), widget.w(), widget.h())) {
    widget.clear_damage(FL_DAMAGE_ALL);
    widget.draw();
    widget.clear_damage();
  }
}